

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-legacy.cc
# Opt level: O2

bool __thiscall DataSourceLegacy::load_animation_table(DataSourceLegacy *this,PBuffer *data)

{
  undefined2 uVar1;
  uint uVar2;
  element_type *peVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  size_t i;
  long lVar8;
  undefined2 *puVar9;
  int j;
  long lVar10;
  ulong uVar11;
  size_t sVar12;
  bool bVar13;
  undefined1 uVar15;
  undefined1 auVar14 [16];
  value_type local_6a4;
  vector<Data::Animation,_std::allocator<Data::Animation>_> animations;
  size_t sizes [200];
  
  peVar3 = (data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar3->endianess = EndianessBig;
  pvVar4 = peVar3->data;
  for (lVar8 = 0; lVar8 != 200; lVar8 = lVar8 + 1) {
    uVar6 = byte_swap<unsigned_int>(*(uint *)((long)pvVar4 + lVar8 * 4));
    *(uint *)((long)pvVar4 + lVar8 * 4) = uVar6;
  }
  uVar5 = ((data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size;
  for (lVar8 = 0; lVar8 != 200; lVar8 = lVar8 + 1) {
    uVar6 = *(uint *)((long)pvVar4 + lVar8 * 4);
    uVar7 = uVar5;
    for (lVar10 = 0; lVar10 != 200; lVar10 = lVar10 + 1) {
      uVar2 = *(uint *)((long)pvVar4 + lVar10 * 4);
      uVar11 = (ulong)uVar2;
      if (uVar7 < uVar2) {
        uVar11 = uVar7;
      }
      if (uVar6 < uVar2) {
        uVar7 = uVar11;
      }
    }
    sizes[lVar8] = (uVar7 - uVar6) / 3;
  }
  for (lVar8 = 0; lVar8 != 200; lVar8 = lVar8 + 1) {
    puVar9 = (undefined2 *)((long)pvVar4 + (long)*(int *)((long)pvVar4 + lVar8 * 4) + 1);
    animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar12 = sizes[lVar8];
    while (bVar13 = sVar12 != 0, sVar12 = sVar12 - 1, bVar13) {
      local_6a4.sprite = *(uint8_t *)((long)puVar9 + -1);
      uVar1 = *puVar9;
      uVar15 = (undefined1)((ushort)uVar1 >> 8);
      auVar14 = ZEXT416(CONCAT22((short)(CONCAT13(uVar15,CONCAT12(uVar15,uVar1)) >> 0x10),
                                 CONCAT11((char)uVar1,(char)uVar1)));
      auVar14 = pshuflw(auVar14,auVar14,0x60);
      local_6a4.x = auVar14._0_4_ >> 0x18;
      local_6a4.y = auVar14._4_4_ >> 0x18;
      std::vector<Data::Animation,_std::allocator<Data::Animation>_>::push_back
                ((vector<Data::Animation,_std::allocator<Data::Animation>_> *)
                 &animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>,
                 &local_6a4);
      puVar9 = (undefined2 *)((long)puVar9 + 3);
    }
    std::
    vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
    ::push_back(&(this->super_DataSourceBase).animation_table,
                (value_type *)
                &animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>);
    std::_Vector_base<Data::Animation,_std::allocator<Data::Animation>_>::~_Vector_base
              (&animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>);
  }
  return true;
}

Assistant:

bool
DataSourceLegacy::load_animation_table(PBuffer data) {
  // The serf animation table is stored in big endian order in the data file.
  data->set_endianess(Buffer::EndianessBig);

  // * Starts with 200 uint32s that are offsets from the start
  // of this table to an animation table (one for each animation).
  // * The animation tables are of varying lengths.
  // Each entry in the animation table is three bytes long.
  // First byte is used to determine the serf body sprite.
  // Second byte is a signed horizontal sprite offset.
  // Third byte is a signed vertical offset.

  if (data == nullptr) {
    return false;
  }
  uint32_t *animation_block = reinterpret_cast<uint32_t*>(data->get_data());

  // Endianess convert from big endian.
  for (size_t i = 0; i < 200; i++) {
    animation_block[i] = betoh(animation_block[i]);
  }

  size_t sizes[200];

  for (size_t i = 0; i < 200; i++) {
    size_t a = animation_block[i];
    size_t next = data->get_size();
    for (int j = 0; j < 200; j++) {
      size_t b = animation_block[j];
      if (b > a) {
        next = std::min(next, b);
      }
    }
    sizes[i] = (next - a)/3;
  }

  for (size_t i = 0; i < 200; i++) {
    int offset = animation_block[i];
    AnimationPhase *anims =
    reinterpret_cast<AnimationPhase*>(reinterpret_cast<char*>(animation_block) +
                                      offset);
    std::vector<Data::Animation> animations;
    for (size_t j = 0; j < sizes[i]; j++) {
      Data::Animation a;
      a.sprite = anims[j].sprite;
      a.x = anims[j].x;
      a.y = anims[j].y;
      animations.push_back(a);
    }
    animation_table.push_back(animations);
  }

  return true;
}